

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::StringToDoubleMap::StringToDoubleMap(StringToDoubleMap *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__StringToDoubleMap_00763138;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  google::protobuf::internal::
  MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
  ::MapFieldLite(&this->map_);
  if (this != (StringToDoubleMap *)&_StringToDoubleMap_default_instance_) {
    protobuf_DataStructures_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  return;
}

Assistant:

StringToDoubleMap::StringToDoubleMap()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_DataStructures_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.StringToDoubleMap)
}